

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::CreateObjectType
          (JavascriptLibrary *this,RecyclableObject *prototype,TypeId typeId,
          uint16 requestedInlineSlotCapacity)

{
  ScriptContext *pSVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  DynamicType *pDVar3;
  RecyclableObject *pRVar4;
  bool bVar5;
  uint16 uVar6;
  int iVar7;
  ScriptContext *pSVar8;
  ScriptContext **ppSVar9;
  undefined4 *puVar10;
  DynamicType *pDVar11;
  DynamicTypeHandler *pDVar12;
  TypePath *typePath;
  ushort local_898;
  uint16 local_896;
  PathTypeHandlerNoAttr *typeHandler;
  uint16 requiredCapacity;
  uint16 cachedCapacity;
  DynamicTypeHandler *dynamicTypeHandler;
  char16 reason [1024];
  DynamicType *oldCachedType;
  DynamicType *pDStack_38;
  bool useCache;
  DynamicType *dynamicType;
  byte local_27;
  uint16 local_26;
  TypeId TStack_24;
  uint16 offsetOfInlineSlots;
  bool useObjectHeaderInlining;
  uint16 requestedInlineSlotCapacity_local;
  RecyclableObject *pRStack_20;
  TypeId typeId_local;
  RecyclableObject *prototype_local;
  JavascriptLibrary *this_local;
  
  local_26 = requestedInlineSlotCapacity;
  TStack_24 = typeId;
  pRStack_20 = prototype;
  prototype_local = (RecyclableObject *)this;
  local_27 = FunctionBody::DoObjectHeaderInliningForConstructor((uint)requestedInlineSlotCapacity);
  if ((bool)local_27) {
    dynamicType._6_2_ = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  }
  else {
    dynamicType._6_2_ = 0x20;
  }
  pDStack_38 = (DynamicType *)0x0;
  pSVar8 = RecyclableObject::GetScriptContext(pRStack_20);
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar1 = *ppSVar9;
  reason[0x3fc] = L'\0';
  reason[0x3fd] = L'\0';
  reason[0x3fe] = L'\0';
  reason[0x3ff] = L'\0';
  swprintf_s((char16_t_conflict *)&dynamicTypeHandler,0x400,
             (char16_t_conflict *)L"Cache not populated.");
  if (TStack_24 != TypeIds_Object) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a90,"(typeId == TypeIds_Object)",
                                "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first."
                               );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pRVar4 = pRStack_20;
  if (pSVar8 == pSVar1) {
    ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    iVar7 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x14])
                      (pRVar4,pRVar4,0,&stack0xffffffffffffffc8,0,*ppSVar9);
    pDVar3 = pDStack_38;
    if (((iVar7 != 0) && (pDStack_38 != (DynamicType *)0x0)) &&
       (pDVar11 = (DynamicType *)
                  JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase),
       pDVar3 != pDVar11)) {
      pDVar12 = DynamicType::GetTypeHandler(pDStack_38);
      bVar5 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar12);
      if (bVar5 == (bool)(local_27 & 1)) {
        uVar6 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar12);
        if ((local_27 & 1) == 0) {
          local_896 = DynamicTypeHandler::RoundUpInlineSlotCapacity(local_26);
        }
        else {
          local_896 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(local_26);
        }
        if (uVar6 == local_896) {
          bVar5 = DynamicType::GetIsShared(pDStack_38);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                        ,0x1aa5,"(dynamicType->GetIsShared())",
                                        "dynamicType->GetIsShared()");
            if (!bVar5) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
          if (bVar5) {
            bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
            if ((bVar5) && ((DAT_01ec73ca & 1) != 0)) {
              Output::Print(L"TypeSharing: Reusing prototype [0x%p] object\'s InlineSlot cache 0x%p in CreateObject.\n"
                            ,pRStack_20,pDStack_38);
            }
            else {
              Output::Print(
                           L"TypeSharing: Reusing prototype object\'s InlineSlot cache in __proto__.\n"
                           );
            }
            Output::Flush();
          }
          return pDStack_38;
        }
      }
      bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
      if ((bVar5) && ((DAT_01ec73ca & 1) != 0)) {
        bVar5 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar12);
        if (bVar5 == (bool)(local_27 & 1)) {
          uVar6 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar12);
          if ((local_27 & 1) == 0) {
            local_898 = DynamicTypeHandler::RoundUpInlineSlotCapacity(local_26);
          }
          else {
            local_898 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(local_26);
          }
          swprintf_s((char16_t_conflict *)&dynamicTypeHandler,0x400,
                     (char16_t_conflict *)L"inlineSlotCapacity mismatch. Required = %d, Cached = %d"
                     ,(ulong)local_898,(ulong)uVar6);
        }
        else {
          swprintf_s((char16_t_conflict *)&dynamicTypeHandler,0x400,
                     (char16_t_conflict *)L"useObjectHeaderInlining mismatch.");
        }
      }
    }
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
  pDVar3 = pDStack_38;
  if ((bVar5) && ((DAT_01ec73ca & 1) != 0)) {
    if (pDStack_38 == (DynamicType *)0x0) {
      swprintf_s((char16_t_conflict *)&dynamicTypeHandler,0x400,
                 (char16_t_conflict *)L"cached type was null");
    }
    else {
      pDVar11 = (DynamicType *)
                JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      if (pDVar3 == pDVar11) {
        swprintf_s((char16_t_conflict *)&dynamicTypeHandler,0x400,
                   (char16_t_conflict *)L"cached type was undefined");
      }
    }
  }
  reason._2040_8_ = pDStack_38;
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar9;
  typePath = GetRootPath(this);
  pDVar12 = (DynamicTypeHandler *)
            PathTypeHandlerNoAttr::New
                      (scriptContext,typePath,0,local_26,dynamicType._6_2_,true,true,
                       (DynamicType *)0x0);
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pDStack_38 = DynamicType::New(*ppSVar9,TStack_24,pRStack_20,RecyclableObject::DefaultEntryPoint,
                                pDVar12,true,true);
  if (pSVar8 == pSVar1) {
    (*(pRStack_20->super_FinalizableObject).super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(pRStack_20,0,pDStack_38,8,0);
    bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
    if (bVar5) {
      bVar5 = Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeShareForChangePrototypePhase);
      if ((bVar5) && ((DAT_01ec73ca & 1) != 0)) {
        Output::Print(L"TypeSharing: Updating prototype [0x%p] object\'s InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"
                      ,pRStack_20,reason._2040_8_,pDStack_38,&dynamicTypeHandler);
      }
      else {
        Output::Print(
                     L"TypeSharing: Updating prototype object\'s InlineSlot cache in CreateObject.\n"
                     );
      }
      Output::Flush();
    }
  }
  return pDStack_38;
}

Assistant:

DynamicType* JavascriptLibrary::CreateObjectType(RecyclableObject* prototype, Js::TypeId typeId, uint16 requestedInlineSlotCapacity)
    {
        const bool useObjectHeaderInlining = FunctionBody::DoObjectHeaderInliningForConstructor(requestedInlineSlotCapacity);
        const uint16 offsetOfInlineSlots =
            useObjectHeaderInlining
            ? DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots()
            : sizeof(DynamicObject);

        DynamicType* dynamicType = nullptr;
        const bool useCache = prototype->GetScriptContext() == this->scriptContext;
#if DBG
        DynamicType* oldCachedType = nullptr;
        char16 reason[1024];
        swprintf_s(reason, 1024, _u("Cache not populated."));
#endif
        // Always use `TypeOfPrototypeObjectInlined` because we are creating DynamicType of TypeIds_Object
        AssertMsg(typeId == TypeIds_Object, "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first.");

        if (useCache &&
            prototype->GetInternalProperty(prototype, Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Js::Var*) &dynamicType, nullptr, this->scriptContext))
        {
            //If the prototype is externalObject, then ExternalObject::Reinitialize can set all the properties to undefined in navigation scenario.
            //Check to make sure dynamicType which is stored as a Js::Var is not undefined.
            //See Blue 419324
            if (dynamicType != nullptr && (Js::Var)dynamicType != this->GetUndefined())
            {
                DynamicTypeHandler *const dynamicTypeHandler = dynamicType->GetTypeHandler();
                if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() == useObjectHeaderInlining &&
                    (
                        dynamicTypeHandler->GetInlineSlotCapacity() ==
                        (
                            useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity)
                            )
                        ))
                {
                    Assert(dynamicType->GetIsShared());

                    if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
                    {
#if DBG
                        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                        {
                            Output::Print(_u("TypeSharing: Reusing prototype [0x%p] object's InlineSlot cache 0x%p in CreateObject.\n"), prototype, dynamicType);
                        }
                        else
                        {
#endif
                            Output::Print(_u("TypeSharing: Reusing prototype object's InlineSlot cache in __proto__.\n"));
#if DBG
                        }
#endif
                        Output::Flush();
                    }

                    return dynamicType;
                }
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() != useObjectHeaderInlining)
                    {
                        swprintf_s(reason, 1024, _u("useObjectHeaderInlining mismatch."));
                    }
                    else
                    {
                        uint16 cachedCapacity = dynamicTypeHandler->GetInlineSlotCapacity();
                        uint16 requiredCapacity = useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);

                        swprintf_s(reason, 1024, _u("inlineSlotCapacity mismatch. Required = %d, Cached = %d"), requiredCapacity, cachedCapacity);
                    }
                }
#endif
            }

        }

#if DBG
        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
        {
            if (dynamicType == nullptr)
            {
                swprintf_s(reason, 1024, _u("cached type was null"));
            }
            else if ((Js::Var)dynamicType == this->GetUndefined())
            {
                swprintf_s(reason, 1024, _u("cached type was undefined"));
            }
        }
        oldCachedType = dynamicType;
#endif
        PathTypeHandlerNoAttr* typeHandler = PathTypeHandlerNoAttr::New(scriptContext, this->GetRootPath(), 0, requestedInlineSlotCapacity, offsetOfInlineSlots, true, true);
        dynamicType = DynamicType::New(scriptContext, typeId, prototype, RecyclableObject::DefaultEntryPoint, typeHandler, true, true);

        if (useCache)
        {
            prototype->SetInternalProperty(Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Var)dynamicType, PropertyOperationFlags::PropertyOperation_Force, nullptr);
            if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
            {
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    Output::Print(_u("TypeSharing: Updating prototype [0x%p] object's InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"), prototype, oldCachedType, dynamicType, reason);
                }
                else
                {
#endif
                    Output::Print(_u("TypeSharing: Updating prototype object's InlineSlot cache in CreateObject.\n"));
#if DBG
                }
#endif
                Output::Flush();
            }
        }

        return dynamicType;
    }